

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_connect(Curl_easy *data)

{
  int iVar1;
  size_t sVar2;
  size_t plen_00;
  ulong __n;
  uchar *pkt;
  size_t client_id_len;
  char *local_a0;
  char *local_98;
  size_t plen;
  char *passwd;
  size_t ulen;
  char *username;
  char *packet;
  size_t clen;
  char client_id [13];
  size_t start_pwd;
  size_t start_user;
  size_t payloadlen;
  size_t packetlen;
  int local_28;
  char remain [4];
  int remain_pos;
  int rc;
  int pos;
  CURLcode result;
  Curl_easy *data_local;
  
  remain[0] = '\0';
  remain[1] = '\0';
  remain[2] = '\0';
  remain[3] = '\0';
  local_28 = 0;
  memset((void *)((long)&packetlen + 4),0,4);
  client_id[5] = '\0';
  client_id[6] = '\0';
  client_id[7] = '\0';
  client_id[8] = '\0';
  client_id[9] = '\0';
  client_id[10] = '\0';
  client_id[0xb] = '\0';
  client_id[0xc] = '\0';
  stack0xffffffffffffffa3 = 0x6c727563;
  client_id[0] = '\0';
  client_id[1] = '\0';
  client_id[2] = '\0';
  client_id[3] = '\0';
  client_id[4] = '\0';
  if ((data->state).aptr.user == (char *)0x0) {
    local_98 = "";
  }
  else {
    local_98 = (data->state).aptr.user;
  }
  sVar2 = strlen(local_98);
  if ((data->state).aptr.passwd == (char *)0x0) {
    local_a0 = "";
  }
  else {
    local_a0 = (data->state).aptr.passwd;
  }
  plen_00 = strlen(local_a0);
  start_user = sVar2 + plen_00 + 0xe;
  if (sVar2 != 0) {
    start_user = sVar2 + plen_00 + 0x10;
  }
  if (plen_00 != 0) {
    start_user = start_user + 2;
  }
  local_28 = mqtt_encode_len((char *)((long)&packetlen + 4),start_user + 10);
  __n = start_user + (long)local_28 + 0xb;
  if (0xfffffff < __n) {
    return CURLE_WEIRD_SERVER_REPLY;
  }
  pkt = (uchar *)(*Curl_cmalloc)(__n);
  if (pkt == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  memset(pkt,0,__n);
  iVar1 = init_connpack((char *)pkt,(char *)((long)&packetlen + 4),local_28);
  rc = Curl_rand_alnum(data,(uchar *)((long)&clen + 7),9);
  client_id_len = strlen((char *)((long)&clen + 3));
  remain = (char  [4])
           add_client_id((char *)((long)&clen + 3),client_id_len,(char *)pkt,(long)(iVar1 + 1));
  if (remain == (char  [4])0x0) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"Using client id \'%s\'",(long)&clen + 3);
    }
    client_id._5_8_ = (long)(iVar1 + 0xf) + sVar2;
    if (sVar2 != 0) {
      client_id._5_8_ = client_id._5_8_ + 2;
      remain = (char  [4])add_user(local_98,sVar2,pkt,(long)(iVar1 + 0xf),local_28);
      if (remain != (char  [4])0x0) {
        Curl_failf(data,"Username is too large: [%zu]",sVar2);
        rc = 8;
        goto LAB_0016656b;
      }
    }
    if ((plen_00 == 0) ||
       (remain = (char  [4])add_passwd(local_a0,plen_00,(char *)pkt,client_id._5_8_,local_28),
       remain == (char  [4])0x0)) {
      if (rc == CURLE_OK) {
        rc = mqtt_send(data,(char *)pkt,__n);
      }
    }
    else {
      Curl_failf(data,"Password is too large: [%zu]",plen_00);
      rc = 8;
    }
  }
  else {
    sVar2 = strlen((char *)((long)&clen + 3));
    Curl_failf(data,"Client ID length mismatched: [%zu]",sVar2);
    rc = 8;
  }
LAB_0016656b:
  if (pkt != (uchar *)0x0) {
    (*Curl_cfree)(pkt);
  }
  (*Curl_cfree)((data->state).aptr.user);
  (data->state).aptr.user = (char *)0x0;
  (*Curl_cfree)((data->state).aptr.passwd);
  (data->state).aptr.passwd = (char *)0x0;
  return rc;
}

Assistant:

static CURLcode mqtt_connect(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  int pos = 0;
  int rc = 0;
  /* remain length */
  int remain_pos = 0;
  char remain[4] = {0};
  size_t packetlen = 0;
  size_t payloadlen = 0;
  size_t start_user = 0;
  size_t start_pwd = 0;
  char client_id[MQTT_CLIENTID_LEN + 1] = "curl";
  const size_t clen = strlen("curl");
  char *packet = NULL;

  /* extracting username from request */
  const char *username = data->state.aptr.user ?
    data->state.aptr.user : "";
  const size_t ulen = strlen(username);
  /* extracting password from request */
  const char *passwd = data->state.aptr.passwd ?
    data->state.aptr.passwd : "";
  const size_t plen = strlen(passwd);

  payloadlen = ulen + plen + MQTT_CLIENTID_LEN + 2;
  /* The plus 2 are for the MSB and LSB describing the length of the string to
   * be added on the payload. Refer to spec 1.5.2 and 1.5.4 */
  if(ulen)
    payloadlen += 2;
  if(plen)
    payloadlen += 2;

  /* getting how much occupy the remain length */
  remain_pos = mqtt_encode_len(remain, payloadlen + 10);

  /* 10 length of variable header and 1 the first byte of the fixed header */
  packetlen = payloadlen + 10 + remain_pos + 1;

  /* allocating packet */
  if(packetlen > 268435455)
    return CURLE_WEIRD_SERVER_REPLY;
  packet = malloc(packetlen);
  if(!packet)
    return CURLE_OUT_OF_MEMORY;
  memset(packet, 0, packetlen);

  /* set initial values for the CONNECT packet */
  pos = init_connpack(packet, remain, remain_pos);

  result = Curl_rand_alnum(data, (unsigned char *)&client_id[clen],
                           MQTT_CLIENTID_LEN - clen + 1);
  /* add client id */
  rc = add_client_id(client_id, strlen(client_id), packet, pos + 1);
  if(rc) {
    failf(data, "Client ID length mismatched: [%zu]", strlen(client_id));
    result = CURLE_WEIRD_SERVER_REPLY;
    goto end;
  }
  infof(data, "Using client id '%s'", client_id);

  /* position where starts the user payload */
  start_user = pos + 3 + MQTT_CLIENTID_LEN;
  /* position where starts the password payload */
  start_pwd = start_user + ulen;
  /* if username was provided, add it to the packet */
  if(ulen) {
    start_pwd += 2;

    rc = add_user(username, ulen,
                  (unsigned char *)packet, start_user, remain_pos);
    if(rc) {
      failf(data, "Username is too large: [%zu]", ulen);
      result = CURLE_WEIRD_SERVER_REPLY;
      goto end;
    }
  }

  /* if passwd was provided, add it to the packet */
  if(plen) {
    rc = add_passwd(passwd, plen, packet, start_pwd, remain_pos);
    if(rc) {
      failf(data, "Password is too large: [%zu]", plen);
      result = CURLE_WEIRD_SERVER_REPLY;
      goto end;
    }
  }

  if(!result)
    result = mqtt_send(data, packet, packetlen);

end:
  if(packet)
    free(packet);
  Curl_safefree(data->state.aptr.user);
  Curl_safefree(data->state.aptr.passwd);
  return result;
}